

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *out_g;
  int vert_end_idx;
  ImGuiWindow *pIVar1;
  char cVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  ImDrawList *pIVar5;
  undefined4 uVar6;
  uint uVar7;
  ImU32 col_00;
  ImU32 col_01;
  undefined8 extraout_RAX;
  char *text_end;
  ulong uVar8;
  char cVar9;
  uint uVar10;
  ImGuiContext *g;
  byte bVar11;
  undefined7 uVar12;
  ImVec2 *pIVar13;
  int iVar14;
  ImU32 col_bot_right;
  undefined1 text [8];
  long lVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  ImVec2 IVar21;
  undefined4 extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  ImVec2 p_min;
  ImVec2 pos;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  float fVar22;
  float fVar23;
  ImVec2 p_max;
  ImVec2 gradient_p1;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 half_sz_00;
  float fVar30;
  uint uVar31;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float local_284;
  float local_280;
  float V;
  ImGuiContext *local_278;
  uint local_26c;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  float local_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  uint local_230;
  float B;
  float G;
  float R;
  ImDrawList *local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  ImVec2 *local_200;
  ImVec2 local_1f8;
  ImU32 local_1f0;
  uint local_1ec;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  ImVec2 local_1c0;
  ImVec2 local_1b8;
  undefined8 uStack_1b0;
  float local_1a8;
  float fStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  ImVec2 current_off_unrotated;
  float vv;
  float fStack_16c;
  ImVec2 local_168;
  ImVec2 picker_pos;
  float ww;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  ImVec2 tra;
  float uu;
  float fStack_f4;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [16];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  size_t local_b0;
  ImGuiWindow *local_a8;
  ImVec2 trc;
  float backup_initial_col [4];
  ImVec2 uv_white;
  ImVec2 trb;
  undefined1 auVar25 [16];
  
  pIVar3 = GImGui;
  uStack_260 = local_268;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems != false) {
    bVar11 = 0;
    goto LAB_0035d014;
  }
  local_220 = pIVar1->DrawList;
  local_200 = (ImVec2 *)col;
  local_248._0_4_ = CalcItemWidth();
  local_248._4_4_ = extraout_XMM0_Db;
  fStack_240 = (float)extraout_XMM0_Dc;
  fStack_23c = (float)extraout_XMM0_Dd;
  local_278 = pIVar3;
  (pIVar3->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar10 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(&local_200->x,uVar10);
  }
  pIVar3 = local_278;
  if ((flags & 0x6000000U) == 0) {
    uVar7 = local_278->ColorEditOptions & 0x6000000;
    uVar17 = 0x2000000;
    if (uVar7 != 0) {
      uVar17 = uVar7;
    }
    uVar10 = uVar10 | uVar17;
  }
  if ((uVar10 & 0x18000000) == 0) {
    uVar7 = local_278->ColorEditOptions & 0x18000000;
    uVar17 = 0x8000000;
    if (uVar7 != 0) {
      uVar17 = uVar7;
    }
    uVar10 = uVar10 | uVar17;
  }
  uVar17 = (uVar10 & 0x6000000) - 1;
  if ((uVar10 & 0x6000000 ^ uVar17) <= uVar17) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui_widgets.cpp"
                  ,0x1183,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  uVar17 = (uVar10 & 0x18000000) - 1;
  if ((uVar10 & 0x18000000 ^ uVar17) <= uVar17) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui_widgets.cpp"
                  ,0x1184,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  local_268 = (undefined1  [8])label;
  if ((uVar10 & 8) == 0) {
    uVar10 = uVar10 | local_278->ColorEditOptions & 0x10000U;
  }
  local_1ec = uVar10 & 0x10002;
  bVar16 = local_1ec == 0x10000;
  IVar21 = (pIVar1->DC).CursorPos;
  picker_pos = IVar21;
  local_a8 = pIVar1;
  local_1a8 = GetFrameHeight();
  pIVar13 = local_200;
  fVar19 = (pIVar3->Style).ItemInnerSpacing.x;
  fVar32 = (float)local_248._0_4_ - (local_1a8 + fVar19) * (float)(byte)(bVar16 + 1);
  uVar17 = -(uint)(fVar32 <= local_1a8);
  fVar30 = (float)(local_248._4_4_ & (uint)extraout_XMM0_Db_00);
  uVar7 = (uint)fStack_240 & extraout_XMM0_Dc_00;
  uVar31 = (uint)fStack_23c & extraout_XMM0_Dd_00;
  fVar22 = (float)(uVar17 & (uint)local_1a8 | ~uVar17 & (uint)fVar32);
  local_b0 = (ulong)((uVar10 & 2) == 0) * 4 + 0xc;
  fStack_1a4 = extraout_XMM0_Db_00;
  uStack_1a0 = extraout_XMM0_Dc_00;
  uStack_19c = extraout_XMM0_Dd_00;
  memcpy(backup_initial_col,local_200,local_b0);
  local_24c = fVar22 * 0.08;
  fVar23 = fVar22 * 0.5;
  _local_c8 = ZEXT416((uint)(fVar23 - local_24c));
  fVar32 = IVar21.x;
  _local_248 = ZEXT416((uint)(fVar19 + fVar22 + fVar32));
  uStack_1b0 = 0;
  local_1f8.x = (local_1a8 + fVar22) * 0.5 + fVar32;
  local_1f8.y = fVar22 * 0.5 + IVar21.y;
  triangle_pa.x = (fVar23 - local_24c) - (float)(int)(fVar22 * 0.027);
  triangle_pa.y = 0.0;
  local_1c0.x = triangle_pa.x * -0.5;
  local_1c0.y = triangle_pa.x * -0.866025;
  local_118._4_4_ = local_1f8.y;
  local_118._0_4_ = local_1f8.x;
  fStack_110 = fStack_1a4 * 0.0 + 0.0;
  fStack_10c = fVar30 * 0.0 + 0.0;
  triangle_pc.y = triangle_pa.x * 0.866025;
  local_284 = pIVar13->x;
  local_280 = pIVar13->y;
  V = pIVar13[1].x;
  B = V;
  G = local_280;
  R = local_284;
  triangle_pc.x = local_1c0.x;
  local_1b8 = IVar21;
  if ((uVar10 >> 0x1b & 1) == 0) {
    if ((uVar10 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_284,local_280,V,&R,&G,&B);
    }
  }
  else {
    ColorConvertRGBtoHSV(local_284,local_280,V,&local_284,&local_280,&V);
    if (((local_280 == 0.0) && (!NAN(local_280))) &&
       (iVar14 = bcmp(local_278->ColorEditLastColor,pIVar13,0xc), iVar14 == 0)) {
      local_284 = local_278->ColorEditLastHue;
    }
  }
  local_218._4_4_ = fStack_1a4;
  local_218._0_4_ = local_1a8 + (float)local_248._0_4_;
  fStack_210 = (float)uStack_1a0;
  fStack_20c = (float)uStack_19c;
  PushItemFlag(8,true);
  pIVar4 = local_278;
  local_128 = local_1b8.y;
  fStack_124 = local_1b8.y;
  fStack_120 = local_1b8.y;
  fStack_11c = local_1b8.y;
  local_d8 = local_1b8.y;
  fStack_d4 = local_1b8.y;
  fStack_d0 = local_1b8.y;
  fStack_cc = local_1b8.y;
  uVar12 = (undefined7)((ulong)pIVar3 >> 8);
  if ((uVar10 >> 0x1a & 1) == 0) {
    if ((uVar10 >> 0x19 & 1) != 0) {
      current_off_unrotated.y = fVar22;
      current_off_unrotated.x = fVar22;
      InvisibleButton("sv",&current_off_unrotated);
      bVar16 = IsItemActive();
      text = local_268;
      if (bVar16) {
        auVar24._0_4_ = fVar22 + -1.0;
        IVar21 = (local_278->IO).MousePos;
        auVar35._0_4_ = IVar21.x - local_1b8.x;
        auVar35._4_4_ = IVar21.y - local_1b8.y;
        auVar35._8_4_ = 0.0 - (float)uStack_1b0;
        auVar35._12_4_ = 0.0 - uStack_1b0._4_4_;
        auVar24._4_4_ = auVar24._0_4_;
        auVar24._8_4_ = auVar24._0_4_;
        auVar24._12_4_ = auVar24._0_4_;
        auVar35 = divps(auVar35,auVar24);
        fVar33 = auVar35._0_4_;
        fVar20 = auVar35._4_4_;
        iVar14 = -(uint)(1.0 < fVar33);
        iVar18 = -(uint)(1.0 < fVar20);
        auVar26._4_4_ = iVar18;
        auVar26._0_4_ = iVar14;
        auVar26._8_4_ = iVar18;
        auVar26._12_4_ = iVar18;
        auVar25._8_8_ = auVar26._8_8_;
        auVar25._4_4_ = iVar14;
        auVar25._0_4_ = iVar14;
        uVar17 = movmskpd((int)local_278,auVar25);
        local_280 = 1.0;
        if ((uVar17 & 1) == 0) {
          local_280 = fVar33;
        }
        local_280 = (float)(~-(uint)(fVar33 < 0.0) & (uint)local_280);
        fVar33 = 0.0;
        if ((uVar17 & 2) == 0) {
          fVar33 = 1.0 - fVar20;
        }
        V = (float)(-(uint)(fVar20 < 0.0) & 0x3f800000 | ~-(uint)(fVar20 < 0.0) & (uint)fVar33);
        uVar17 = (uint)CONCAT71((uint7)(uint3)(uVar17 >> 8),1);
      }
      else {
        uVar17 = 0;
      }
      if ((uVar10 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      current_off_unrotated.y = local_128;
      current_off_unrotated.x = (float)local_248._0_4_;
      SetCursorScreenPos(&current_off_unrotated);
      current_off_unrotated.y = fVar22;
      current_off_unrotated.x = local_1a8;
      InvisibleButton("hue",&current_off_unrotated);
      bVar16 = IsItemActive();
      if (bVar16) {
        fVar33 = ((local_278->IO).MousePos.y - local_d8) / (fVar22 + -1.0);
        local_284 = 1.0;
        if (fVar33 <= 1.0) {
          local_284 = fVar33;
        }
        local_284 = (float)(~-(uint)(fVar33 < 0.0) & (uint)local_284);
        local_26c = (uint)CONCAT71((int7)((ulong)local_278 >> 8),1);
        uVar8 = CONCAT71(uVar12,1);
      }
      else {
        local_26c = 0;
        uVar8 = (ulong)uVar17;
      }
      goto LAB_0035be53;
    }
    cVar2 = '\0';
    local_26c = 0;
    uVar8 = 0;
    text = local_268;
  }
  else {
    current_off_unrotated.y = fVar22;
    current_off_unrotated.x = (local_278->Style).ItemInnerSpacing.x + fVar22 + local_1a8;
    InvisibleButton("hsv",&current_off_unrotated);
    bVar16 = IsItemActive();
    if (bVar16) {
      fVar37 = (pIVar4->IO).MouseClickedPos[0].x - (float)local_118._0_4_;
      fVar38 = (pIVar4->IO).MouseClickedPos[0].y - (float)local_118._4_4_;
      fVar20 = (pIVar4->IO).MousePos.x - (float)local_118._0_4_;
      fVar33 = (pIVar4->IO).MousePos.y - (float)local_118._4_4_;
      local_e8 = ZEXT416((uint)fVar38);
      fVar38 = fVar37 * fVar37 + fVar38 * fVar38;
      text = local_268;
      _local_118 = ZEXT416((uint)fVar37);
      if ((fVar38 < ((float)local_c8._0_4_ + -1.0) * ((float)local_c8._0_4_ + -1.0)) ||
         ((fVar23 + 1.0) * (fVar23 + 1.0) < fVar38)) {
        local_26c = 0;
      }
      else {
        fVar38 = atan2f(fVar33,fVar20);
        fVar38 = (fVar38 / 3.1415927) * 0.5;
        local_284 = (float)(~-(uint)(fVar38 < 0.0) & (uint)fVar38 |
                           (uint)(fVar38 + 1.0) & -(uint)(fVar38 < 0.0));
        local_26c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_1b8.x = cosf(local_284 * -2.0 * 3.1415927);
      local_1b8.y = extraout_XMM0_Db_01;
      uStack_1b0 = CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01);
      fVar38 = sinf(local_284 * -2.0 * 3.1415927);
      uVar6 = local_118._0_4_;
      local_118._4_4_ = extraout_XMM0_Db_02;
      local_118._0_4_ = fVar38;
      fStack_110 = (float)extraout_XMM0_Dc_02;
      fStack_10c = (float)extraout_XMM0_Dd_02;
      current_off_unrotated.x = local_1b8.x * (float)uVar6 + -(float)local_e8._0_4_ * fVar38;
      current_off_unrotated.y = fVar38 * (float)uVar6 + local_1b8.x * (float)local_e8._0_4_;
      bVar16 = ImTriangleContainsPoint(&triangle_pa,&local_1c0,&triangle_pc,&current_off_unrotated);
      if (bVar16) {
        current_off_unrotated.x = local_1b8.x * fVar20 + -fVar33 * (float)local_118._0_4_;
        current_off_unrotated.y = (float)local_118._0_4_ * fVar20 + local_1b8.x * fVar33;
        bVar16 = ImTriangleContainsPoint
                           (&triangle_pa,&local_1c0,&triangle_pc,&current_off_unrotated);
        if (!bVar16) {
          current_off_unrotated =
               ImTriangleClosestPoint(&triangle_pa,&local_1c0,&triangle_pc,&current_off_unrotated);
        }
        ImTriangleBarycentricCoords
                  (&triangle_pa,&local_1c0,&triangle_pc,&current_off_unrotated,&uu,&vv,&ww);
        fVar20 = 1.0 - vv;
        fVar33 = 1.0;
        if (fVar20 <= 1.0) {
          fVar33 = fVar20;
        }
        V = (float)(-(uint)(fVar20 < 0.0001) & 0x38d1b717 | ~-(uint)(fVar20 < 0.0001) & (uint)fVar33
                   );
        fVar20 = uu / V;
        fVar33 = 1.0;
        if (fVar20 <= 1.0) {
          fVar33 = fVar20;
        }
        local_280 = (float)(-(uint)(fVar20 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar20 < 0.0001) & (uint)fVar33);
        uVar17 = 1;
        uVar8 = CONCAT71(uVar12,1);
        goto LAB_0035be27;
      }
      uVar17 = 0;
      uVar8 = (ulong)local_26c;
    }
    else {
      uVar17 = 0;
      local_26c = 0;
      uVar8 = 0;
LAB_0035be27:
      text = local_268;
    }
    if ((uVar10 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
LAB_0035be53:
    cVar2 = (char)uVar17;
  }
  fVar19 = fVar19 + (float)local_218._0_4_;
  if (local_1ec == 0x10000) {
    current_off_unrotated.y = local_128;
    current_off_unrotated.x = fVar19;
    SetCursorScreenPos(&current_off_unrotated);
    current_off_unrotated.y = fVar22;
    current_off_unrotated.x = local_1a8;
    InvisibleButton("alpha",&current_off_unrotated);
    bVar16 = IsItemActive();
    if (bVar16) {
      fVar20 = ((local_278->IO).MousePos.y - local_d8) / (fVar22 + -1.0);
      fVar33 = 1.0;
      if (fVar20 <= 1.0) {
        fVar33 = fVar20;
      }
      pIVar13[1].y = (float)(-(uint)(fVar20 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar20 < 0.0) & (uint)(1.0 - fVar33));
      uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
    }
  }
  PopItemFlag();
  if ((uVar10 >> 8 & 1) == 0) {
    SameLine(0.0,(local_278->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar10) &&
     (text_end = FindRenderedTextEnd((char *)text,(char *)0x0), (undefined1  [8])text_end != text))
  {
    if ((uVar10 >> 8 & 1) != 0) {
      SameLine(0.0,(local_278->Style).ItemInnerSpacing.x);
    }
    TextEx((char *)text,text_end,0);
  }
  if ((uVar10 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    current_off_unrotated = *pIVar13;
    if ((char)uVar10 < '\0') {
      Text("Current");
    }
    IVar21.x = local_1a8 * 3.0;
    IVar21.y = local_1a8 * 2.0;
    uStack_260._0_4_ = local_1a8 * 0.0;
    local_268._0_4_ = IVar21.x;
    local_268._4_4_ = IVar21.y;
    uStack_260._4_4_ = local_1a8 * 0.0;
    ColorButton("##current",(ImVec4 *)&current_off_unrotated,uVar10 & 0x180e0040,IVar21);
    if (ref_col != (float *)0x0) {
      Text("Original");
      uu = ref_col[0];
      fStack_f4 = ref_col[1];
      local_f0 = ref_col[2];
      if ((uVar10 & 2) == 0) {
        local_ec = ref_col[3];
      }
      else {
        local_ec = 1.0;
      }
      bVar16 = ColorButton("##original",(ImVec4 *)&uu,uVar10 & 0x180e0040,(ImVec2)local_268);
      if (bVar16) {
        memcpy(pIVar13,ref_col,local_b0);
        uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  fVar33 = local_1a8 * 0.2;
  fVar20 = 0.0;
  fVar38 = 0.0;
  fVar37 = 0.0;
  out_g = &pIVar13->y;
  if (((char)local_26c != '\0') || (cVar2 != '\0')) {
    if ((uVar10 >> 0x1b & 1) == 0) {
      if ((uVar10 >> 0x1c & 1) != 0) {
        pIVar13->x = local_284;
        pIVar13->y = local_280;
        pIVar13[1].x = V;
      }
    }
    else {
      _local_268 = ZEXT416((uint)fVar33);
      ColorConvertHSVtoRGB
                ((float)(~-(uint)(1.0 <= local_284) & (uint)local_284 |
                        (uint)(local_284 + -1e-05) & -(uint)(1.0 <= local_284)),
                 (float)(~-(uint)(0.0 < local_280) & 0x3727c5ac |
                        (uint)local_280 & -(uint)(0.0 < local_280)),
                 (float)(~-(uint)(0.0 < V) & 0x358637bd | (uint)V & -(uint)(0.0 < V)),&pIVar13->x,
                 out_g,&pIVar13[1].x);
      local_278->ColorEditLastHue = local_284;
      fVar33 = pIVar13->y;
      local_278->ColorEditLastColor[0] = pIVar13->x;
      local_278->ColorEditLastColor[1] = fVar33;
      local_278->ColorEditLastColor[2] = pIVar13[1].x;
      fVar33 = (float)local_268._0_4_;
      fVar20 = (float)local_268._4_4_;
      fVar38 = (float)uStack_260;
      fVar37 = uStack_260._4_4_;
    }
  }
  iVar14 = (int)fVar33;
  if ((uVar10 & 0x20) == 0) {
    local_268._4_4_ = (int)fVar20;
    local_268._0_4_ = (int)fVar33;
    uStack_260._0_4_ = (float)(int)fVar38;
    uStack_260._4_4_ = (float)(int)fVar37;
    uVar8 = uVar8 & 0xffffffff;
    fVar33 = fVar19;
    if (local_1ec != 0x10000) {
      fVar33 = (float)local_248._0_4_;
    }
    local_1b8 = (ImVec2)(pIVar13 + 1);
    PushItemWidth((fVar33 + local_1a8) - fVar32);
    uVar17 = uVar10 & 0x198e001a;
    cVar9 = '\x01';
    if (((uVar10 >> 0x14 & 1) != 0 || (uVar10 & 0x600000) == 0) &&
       (bVar16 = ColorEdit4("##rgb",&pIVar13->x,uVar17 | 0x100004), bVar16)) {
      uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
      if (local_278->ActiveId == 0) {
        cVar9 = '\x01';
      }
      else {
        cVar9 = local_278->ActiveIdAllowOverlap;
      }
    }
    if ((uVar10 >> 0x15 & 1) != 0 || (uVar10 & 0x500000) == 0) {
      bVar16 = ColorEdit4("##hsv",&pIVar13->x,uVar17 | 0x200004);
      uVar8 = CONCAT71((int7)(uVar8 >> 8),(byte)uVar8 | bVar16);
    }
    if ((uVar10 >> 0x16 & 1) != 0 || (uVar10 & 0x300000) == 0) {
      bVar16 = ColorEdit4("##hex",&pIVar13->x,uVar17 | 0x400004);
      uVar8 = CONCAT71((int7)(uVar8 >> 8),(byte)uVar8 | bVar16);
    }
    PopItemWidth();
    pIVar13 = local_200;
    if ((uVar10 >> 0x1b & 1) != 0 && cVar9 == '\0') {
      ColorConvertRGBtoHSV
                (local_200->x,local_200->y,local_200[1].x,&current_off_unrotated.x,&uu,&vv);
      if ((current_off_unrotated.x <= 0.0) && (0.0 < local_284)) {
        if (0.0 < vv) {
LAB_0035c37f:
          if (0.0 < uu) goto LAB_0035c3a2;
          fVar33 = local_280 * 0.5;
        }
        else {
          if ((V == vv) && (!NAN(V) && !NAN(vv))) goto LAB_0035c37f;
          vv = V * 0.5;
          fVar33 = local_280;
        }
        ColorConvertHSVtoRGB(local_284,fVar33,vv,&pIVar13->x,out_g,(float *)local_1b8);
      }
    }
LAB_0035c3a2:
    iVar14 = local_268._0_4_;
  }
  fVar33 = (float)iVar14;
  if ((char)uVar8 != '\0') {
    if ((uVar10 >> 0x1b & 1) == 0) {
      if ((uVar10 >> 0x1c & 1) != 0) {
        local_284 = pIVar13->x;
        local_280 = pIVar13->y;
        V = pIVar13[1].x;
        ColorConvertHSVtoRGB(local_284,local_280,V,&R,&G,&B);
      }
    }
    else {
      R = pIVar13->x;
      G = pIVar13->y;
      B = pIVar13[1].x;
      ColorConvertRGBtoHSV(R,G,B,&local_284,&local_280,&V);
      if (((local_280 == 0.0) && (!NAN(local_280))) &&
         (iVar14 = bcmp(local_278->ColorEditLastColor,pIVar13,0xc), iVar14 == 0)) {
        local_284 = local_278->ColorEditLastHue;
      }
    }
  }
  pIVar3 = local_278;
  local_ec = (local_278->Style).Alpha;
  fVar20 = 1.0;
  if (local_ec <= 1.0) {
    fVar20 = local_ec;
  }
  iVar14 = (int)((float)(~-(uint)(local_ec < 0.0) & (uint)fVar20) * 255.0 + 0.5);
  uu = 1.0;
  fStack_f4 = 1.0;
  local_f0 = 1.0;
  col_bot_right = iVar14 * 0x1000000;
  local_268 = (undefined1  [8])(CONCAT44(iVar14 << 0x18,iVar14 << 0x18) | 0xffff000000ff);
  uStack_260._0_4_ = (float)(iVar14 << 0x18 | 0xff00);
  uStack_260._4_4_ = (float)(iVar14 << 0x18 | 0xffff00);
  local_128 = (float)(col_bot_right + 0xffffff);
  current_off_unrotated = (ImVec2)(CONCAT44(iVar14 << 0x18,iVar14 << 0x18) | 0xffff000000ff);
  local_e8._0_4_ = col_bot_right + 0x808080;
  ColorConvertHSVtoRGB(local_284,1.0,1.0,&uu,&fStack_f4,&local_f0);
  col_00 = ColorConvertFloat4ToU32((ImVec4 *)&uu);
  fStack_16c = G;
  vv = R;
  local_168.y = (pIVar3->Style).Alpha;
  local_168.x = B;
  col_01 = ColorConvertFloat4ToU32((ImVec4 *)&vv);
  pIVar5 = local_220;
  ww = 0.0;
  fStack_12c = 0.0;
  fVar20 = (float)local_268._0_4_;
  if ((uVar10 >> 0x1a & 1) == 0) {
    if ((uVar10 >> 0x19 & 1) != 0) {
      fStack_16c = local_d8 + fVar22;
      vv = fVar22 + fVar32;
      local_230 = (uint)uVar8;
      local_1f0 = col_01;
      ImDrawList::AddRectFilledMultiColor
                (local_220,&picker_pos,(ImVec2 *)&vv,(ImU32)local_128,col_00,col_00,(ImU32)local_128
                );
      local_268._4_4_ = fVar22;
      local_268._0_4_ = fVar22;
      uStack_260._0_4_ = fVar22;
      uStack_260._4_4_ = fVar22;
      vv = picker_pos.x + fVar22;
      fStack_16c = picker_pos.y + fVar22;
      ImDrawList::AddRectFilledMultiColor
                (pIVar5,&picker_pos,(ImVec2 *)&vv,0,0,col_bot_right,col_bot_right);
      p_max.x = (float)local_268._0_4_ + picker_pos.x;
      p_max.y = (float)local_268._4_4_ + picker_pos.y;
      RenderFrameBorder(picker_pos,p_max,0.0);
      auVar34._4_4_ = 1.0 - V;
      auVar34._0_4_ = local_280;
      auVar34._8_8_ = 0;
      auVar35 = minps(_DAT_005d8720,auVar34);
      fVar32 = picker_pos.x;
      fVar23 = picker_pos.y;
      auVar27._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_280) & auVar35._0_4_) * (float)local_268._0_4_
                        + fVar32 + 0.5);
      auVar27._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - V) & auVar35._4_4_) * (float)local_268._4_4_ +
                        fVar23 + 0.5);
      auVar27._8_4_ = (float)(int)(auVar35._8_4_ * (float)uStack_260 + 0.0 + 0.0);
      auVar27._12_4_ = (float)(int)(auVar35._12_4_ * uStack_260._4_4_ + 0.0 + 0.0);
      auVar36._0_4_ = (float)local_268._0_4_ + fVar32 + -2.0;
      auVar36._4_4_ = (float)local_268._4_4_ + fVar23 + -2.0;
      auVar36._8_4_ = (float)uStack_260 + 0.0 + 0.0;
      auVar36._12_4_ = uStack_260._4_4_ + 0.0 + 0.0;
      auVar35 = minps(auVar36,auVar27);
      uVar10 = -(uint)(auVar27._0_4_ < fVar32 + 2.0);
      uVar17 = -(uint)(auVar27._4_4_ < fVar23 + 2.0);
      fStack_12c = (float)(~uVar17 & auVar35._4_4_ | (uint)(fVar23 + 2.0) & uVar17);
      ww = (float)(~uVar10 & auVar35._0_4_ | (uint)(fVar32 + 2.0) & uVar10);
      local_268._4_4_ = fVar30;
      local_268._0_4_ = fVar22 / 6.0;
      uStack_260._0_4_ = (float)uVar7;
      uStack_260._4_4_ = (float)uVar31;
      lVar15 = 0;
      while( true ) {
        if (lVar15 == 6) break;
        fStack_16c = (float)(int)lVar15 * (float)local_268._0_4_ + picker_pos.y;
        vv = (float)local_248._0_4_;
        tra.y = (float)(int)(lVar15 + 1) * (float)local_268._0_4_ + picker_pos.y;
        tra.x = (float)local_218._0_4_;
        fVar32 = (&current_off_unrotated.y)[lVar15];
        ImDrawList::AddRectFilledMultiColor
                  (local_220,(ImVec2 *)&vv,&tra,(ImU32)fVar20,(ImU32)fVar20,(ImU32)fVar32,
                   (ImU32)fVar32);
        lVar15 = lVar15 + 1;
        fVar20 = fVar32;
      }
      _local_268 = ZEXT416((uint)(float)(int)(local_284 * fVar22 + picker_pos.y + 0.5));
      p_min.y = picker_pos.y;
      p_min.x = (float)local_248._0_4_;
      p_max_00.y = fVar22 + picker_pos.y;
      p_max_00.x = (float)local_218._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_248._0_4_ + -1.0;
      pos.y = (float)local_268._0_4_;
      half_sz.x = fVar33 + 1.0;
      half_sz.y = fVar33;
      RenderArrowsForVerticalBar(local_220,pos,half_sz,local_1a8 + 2.0,(local_278->Style).Alpha);
      uVar10 = local_230;
      goto LAB_0035cdb2;
    }
  }
  else {
    iVar14 = 4;
    if (4 < (int)fVar23 / 0xc) {
      iVar14 = (int)fVar23 / 0xc;
    }
    local_118._4_4_ = 0x80000000;
    local_118._0_4_ = -(0.5 / fVar23);
    fStack_110 = -0.0;
    fStack_10c = -0.0;
    fVar30 = fVar23 + (float)local_c8._0_4_;
    local_d8 = fVar30 * 0.5;
    local_c8._4_4_ = local_c8._0_4_;
    fStack_c0 = (float)local_c8._0_4_;
    fStack_bc = (float)local_c8._0_4_;
    fVar32 = (float)local_268._0_4_;
    local_230 = (uint)uVar8;
    local_1f0 = col_01;
    for (lVar15 = 0; lVar15 != 6; lVar15 = lVar15 + 1) {
      fVar20 = (float)(int)lVar15 / 6.0;
      fVar38 = (fVar20 + fVar20) * 3.1415927 + (float)local_118._0_4_;
      local_1b8.x = fVar38;
      fVar20 = ((float)(int)lVar15 + 1.0) / 6.0;
      fVar20 = (fVar20 + fVar20) * 3.1415927 + 0.5 / fVar23;
      local_268._0_4_ = fVar20;
      iVar18 = (pIVar5->VtxBuffer).Size;
      ImDrawList::PathArcTo(pIVar5,&local_1f8,local_d8,fVar38,fVar20,iVar14);
      ImDrawList::PathStroke(pIVar5,(ImU32)local_128,false,local_24c);
      vert_end_idx = (pIVar5->VtxBuffer).Size;
      _local_218 = ZEXT416((uint)local_1f8.x);
      local_248._0_4_ = cosf(local_1b8.x);
      local_248._4_4_ = extraout_XMM0_Db_03;
      fStack_240 = (float)extraout_XMM0_Dc_03;
      fStack_23c = (float)extraout_XMM0_Dd_03;
      auVar28._4_4_ = local_1f8.y;
      auVar28._0_4_ = local_218._0_4_;
      auVar28._8_4_ = local_218._4_4_;
      auVar28._12_4_ = 0;
      _local_218 = auVar28;
      fVar20 = sinf(local_1b8.x);
      fVar38 = (float)local_248._4_4_ * fStack_c0;
      local_248._4_4_ = fVar20 * (float)local_c8._4_4_ + (float)local_218._4_4_;
      local_248._0_4_ = (float)local_248._0_4_ * (float)local_c8._0_4_ + (float)local_218._0_4_;
      fStack_240 = fVar38 + fStack_210;
      fStack_23c = extraout_XMM0_Db_04 * fStack_bc + fStack_20c;
      _local_218 = ZEXT416((uint)local_1f8.x);
      local_1b8.x = cosf((float)local_268._0_4_);
      local_1b8.y = extraout_XMM0_Db_05;
      uStack_1b0 = CONCAT44(extraout_XMM0_Dd_04,extraout_XMM0_Dc_04);
      auVar29._4_4_ = local_1f8.y;
      auVar29._0_4_ = local_218._0_4_;
      auVar29._8_4_ = local_218._4_4_;
      auVar29._12_4_ = 0;
      _local_218 = auVar29;
      fVar20 = sinf((float)local_268._0_4_);
      gradient_p1.x = local_1b8.x * (float)local_c8._0_4_ + (float)local_218._0_4_;
      gradient_p1.y = fVar20 * (float)local_c8._4_4_ + (float)local_218._4_4_;
      fVar20 = (&current_off_unrotated.y)[lVar15];
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar5,iVar18,vert_end_idx,(ImVec2)local_248,gradient_p1,(ImU32)fVar32,
                 (ImU32)fVar20);
      fVar32 = fVar20;
    }
    local_248._0_4_ = cosf((local_284 + local_284) * 3.1415927);
    local_248._4_4_ = extraout_XMM0_Db_06;
    fStack_240 = (float)extraout_XMM0_Dc_05;
    fStack_23c = (float)extraout_XMM0_Dd_05;
    local_218._0_4_ = sinf((local_284 + local_284) * 3.1415927);
    pIVar5 = local_220;
    uVar10 = local_230;
    local_218._4_4_ = extraout_XMM0_Db_07;
    fStack_210 = (float)extraout_XMM0_Dc_06;
    fStack_20c = (float)extraout_XMM0_Dd_06;
    vv = (float)local_248._0_4_ * fVar30 * 0.5 + local_1f8.x;
    fStack_16c = (float)local_218._0_4_ * fVar30 * 0.5 + local_1f8.y;
    if ((char)local_26c == '\0') {
      fVar32 = 0.55;
    }
    else {
      fVar32 = 0.65;
    }
    local_24c = local_24c * fVar32;
    iVar14 = 0x20;
    if ((int)(local_24c / 1.4) < 0x20) {
      iVar14 = (int)(local_24c / 1.4);
    }
    iVar18 = 9;
    if (9 < iVar14) {
      iVar18 = iVar14;
    }
    ImDrawList::AddCircleFilled(local_220,(ImVec2 *)&vv,local_24c,col_00,iVar18);
    ImDrawList::AddCircle(pIVar5,(ImVec2 *)&vv,local_24c + 1.0,local_e8._0_4_,iVar18,1.0);
    ImDrawList::AddCircle(pIVar5,(ImVec2 *)&vv,local_24c,(ImU32)local_128,iVar18,1.0);
    tra.x = triangle_pa.x * (float)local_248._0_4_ + -triangle_pa.y * (float)local_218._0_4_ +
            local_1f8.x;
    tra.y = triangle_pa.x * (float)local_218._0_4_ + triangle_pa.y * (float)local_248._0_4_ +
            local_1f8.y;
    trb.x = local_1c0.x * (float)local_248._0_4_ + -local_1c0.y * (float)local_218._0_4_ +
            local_1f8.x;
    trb.y = local_1c0.x * (float)local_218._0_4_ + local_1c0.y * (float)local_248._0_4_ +
            local_1f8.y;
    trc.x = triangle_pc.x * (float)local_248._0_4_ + -triangle_pc.y * (float)local_218._0_4_ +
            local_1f8.x;
    trc.y = triangle_pc.x * (float)local_218._0_4_ + triangle_pc.y * (float)local_248._0_4_ +
            local_1f8.y;
    uv_white = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve(pIVar5,6,6);
    ImDrawList::PrimVtx(pIVar5,&tra,&uv_white,col_00);
    ImDrawList::PrimVtx(pIVar5,&trb,&uv_white,col_00);
    fVar32 = local_128;
    ImDrawList::PrimVtx(pIVar5,&trc,&uv_white,(ImU32)local_128);
    ImDrawList::PrimVtx(pIVar5,&tra,&uv_white,0);
    ImDrawList::PrimVtx(pIVar5,&trb,&uv_white,(ImU32)fVar32);
    ImDrawList::PrimVtx(pIVar5,&trc,&uv_white,0);
    ImDrawList::AddTriangle(pIVar5,&tra,&trb,&trc,local_e8._0_4_,1.5);
    fVar32 = 1.0;
    if (local_280 <= 1.0) {
      fVar32 = local_280;
    }
    fVar32 = (float)(~-(uint)(local_280 < 0.0) & (uint)fVar32);
    fVar30 = 1.0 - V;
    fVar23 = 1.0;
    if (fVar30 <= 1.0) {
      fVar23 = fVar30;
    }
    fVar23 = (float)(~-(uint)(fVar30 < 0.0) & (uint)fVar23);
    fVar30 = fVar32 * (tra.x - trc.x) + trc.x;
    fVar32 = fVar32 * (tra.y - trc.y) + trc.y;
    ww = fVar23 * (trb.x - fVar30) + fVar30;
    fStack_12c = fVar23 * (trb.y - fVar32) + fVar32;
LAB_0035cdb2:
    uVar8 = (ulong)uVar10;
    col_01 = local_1f0;
  }
  pIVar13 = local_200;
  pIVar5 = local_220;
  if (cVar2 == '\0') {
    fVar32 = 6.0;
  }
  else {
    fVar32 = 10.0;
  }
  local_248._0_4_ = fVar32;
  ImDrawList::AddCircleFilled(local_220,(ImVec2 *)&ww,fVar32,col_01,0xc);
  ImDrawList::AddCircle(pIVar5,(ImVec2 *)&ww,(float)local_248._0_4_ + 1.0,local_e8._0_4_,0xc,1.0);
  ImDrawList::AddCircle(pIVar5,(ImVec2 *)&ww,(float)local_248._0_4_,(ImU32)local_128,0xc,1.0);
  if (local_1ec == 0x10000) {
    fVar32 = pIVar13[1].y;
    _local_218 = ZEXT416((uint)fVar32);
    fVar23 = 1.0;
    if (fVar32 <= 1.0) {
      fVar23 = fVar32;
    }
    _local_248 = ZEXT416((uint)(1.0 - fVar23));
    fStack_16c = picker_pos.y;
    vv = fVar19;
    local_168.x = fVar19 + local_1a8;
    local_168.y = picker_pos.y + fVar22;
    RenderColorRectWithAlphaCheckerboard
              (_vv,local_168,0,(local_168.x - fVar19) * 0.5,(ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (pIVar5,(ImVec2 *)&vv,&local_168,col_01,col_01,col_01 & 0xffffff,col_01 & 0xffffff);
    pIVar13 = local_200;
    local_248._4_4_ = (float)(int)(float)(~local_218._4_4_ & local_248._4_4_);
    local_248._0_4_ =
         (float)(int)((float)(-(uint)((float)local_218._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_218._0_4_ < 0.0) & local_248._0_4_) * fVar22 +
                      picker_pos.y + 0.5);
    fStack_240 = (float)(int)(float)(~(uint)fStack_210 & (uint)fStack_240);
    fStack_23c = (float)(int)(float)(~(uint)fStack_20c & (uint)fStack_23c);
    RenderFrameBorder(_vv,local_168,0.0);
    pos_00.x = fVar19 + -1.0;
    pos_00.y = (float)local_248._0_4_;
    half_sz_00.x = fVar33 + 1.0;
    half_sz_00.y = fVar33;
    RenderArrowsForVerticalBar(pIVar5,pos_00,half_sz_00,local_1a8 + 2.0,(local_278->Style).Alpha);
  }
  EndGroup();
  pIVar1 = local_a8;
  if ((char)uVar8 != '\0') {
    iVar14 = bcmp(backup_initial_col,pIVar13,local_b0);
    uVar8 = uVar8 & 0xff;
    if (iVar14 == 0) {
      uVar8 = 0;
    }
  }
  bVar11 = (byte)uVar8;
  if ((uVar8 & 1) != 0) {
    MarkItemEdited((pIVar1->DC).LastItemId);
  }
  PopID();
LAB_0035d014:
  return (bool)(bVar11 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        if (S == 0 && memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0)
            H = g.ColorEditLastHue;
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            memcpy(g.ColorEditLastColor, col, sizeof(float) * 3);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differenciating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            if (S == 0 && memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0) // Fix local Hue as display below will use it immediately.
                H = g.ColorEditLastHue;
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_white);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}